

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_trainer.cc
# Opt level: O0

SentencePieceTrainer * __thiscall
sentencepiece::SentencePieceTrainer::PopulateNormalizerSpec
          (SentencePieceTrainer *this,NormalizerSpec *normalizer_spec,bool is_denormalizer)

{
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  StatusBuilder *pSVar4;
  string *psVar5;
  string_view filename;
  string_view name;
  undefined1 auVar6 [16];
  undefined1 local_368 [8];
  CharsMap chars_map;
  StatusBuilder local_330;
  int local_1b0 [4];
  StatusBuilder local_1a0;
  byte local_19;
  NormalizerSpec *pNStack_18;
  bool is_denormalizer_local;
  NormalizerSpec *normalizer_spec_local;
  Status *_status;
  
  local_19 = is_denormalizer;
  pNStack_18 = normalizer_spec;
  normalizer_spec_local = (NormalizerSpec *)this;
  if (normalizer_spec == (NormalizerSpec *)0x0) {
    util::StatusBuilder::StatusBuilder(&local_1a0,kInternal);
    pSVar4 = util::StatusBuilder::operator<<
                       (&local_1a0,(char (*) [29])"src/sentencepiece_trainer.cc");
    pSVar4 = util::StatusBuilder::operator<<(pSVar4,(char (*) [2])0x3a86b0);
    local_1b0[0] = 0xee;
    pSVar4 = util::StatusBuilder::operator<<(pSVar4,local_1b0);
    pSVar4 = util::StatusBuilder::operator<<(pSVar4,(char (*) [4])") [");
    pSVar4 = util::StatusBuilder::operator<<(pSVar4,(char (*) [16])0x3a97af);
    util::StatusBuilder::operator<<(pSVar4,(char (*) [3])"] ");
    util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this);
    util::StatusBuilder::~StatusBuilder(&local_1a0);
    return this;
  }
  NormalizerSpec::normalization_rule_tsv_abi_cxx11_(normalizer_spec);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    NormalizerSpec::precompiled_charsmap_abi_cxx11_(pNStack_18);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      util::StatusBuilder::StatusBuilder(&local_330,kInternal);
      pSVar4 = util::StatusBuilder::operator<<
                         (&local_330,(char (*) [29])"src/sentencepiece_trainer.cc");
      pSVar4 = util::StatusBuilder::operator<<(pSVar4,(char (*) [2])0x3a86b0);
      chars_map._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0xf1;
      pSVar4 = util::StatusBuilder::operator<<
                         (pSVar4,(int *)((long)&chars_map._M_t._M_impl.super__Rb_tree_header.
                                                _M_node_count + 4));
      pSVar4 = util::StatusBuilder::operator<<(pSVar4,(char (*) [4])") [");
      pSVar4 = util::StatusBuilder::operator<<
                         (pSVar4,(char (*) [48])"normalizer_spec->precompiled_charsmap().empty()");
      pSVar4 = util::StatusBuilder::operator<<(pSVar4,(char (*) [3])"] ");
      util::StatusBuilder::operator<<
                (pSVar4,(char (*) [41])"precompiled_charsmap is already defined.");
      util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this);
      util::StatusBuilder::~StatusBuilder(&local_330);
      return this;
    }
    std::
    map<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
    ::map((map<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
           *)local_368);
    psVar5 = NormalizerSpec::normalization_rule_tsv_abi_cxx11_(pNStack_18);
    auVar6 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar5);
    filename._M_str = auVar6._0_8_;
    filename._M_len = (size_t)this;
    normalizer::Builder::LoadCharsMap(filename,auVar6._8_8_);
    bVar1 = util::Status::ok((Status *)this);
    bVar2 = !bVar1;
    if (bVar1) {
      sentencepiece::util::Status::~Status((Status *)this);
      psVar5 = NormalizerSpec::mutable_precompiled_charsmap_abi_cxx11_(pNStack_18);
      normalizer::Builder::CompileCharsMap((Builder *)this,(CharsMap *)local_368,psVar5);
      bVar1 = util::Status::ok((Status *)this);
      bVar2 = !bVar1;
      if (bVar1) {
        sentencepiece::util::Status::~Status((Status *)this);
        NormalizerSpec::set_name(pNStack_18,"user_defined");
        bVar2 = false;
      }
    }
    std::
    map<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
    ::~map((map<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
            *)local_368);
    if (bVar2) {
      return this;
    }
  }
  else if ((local_19 & 1) == 0) {
    NormalizerSpec::name_abi_cxx11_(pNStack_18);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) != 0) {
      NormalizerSpec::set_name(pNStack_18,(anonymous_namespace)::kDefaultNormalizerName);
    }
    NormalizerSpec::precompiled_charsmap_abi_cxx11_(pNStack_18);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) != 0) {
      psVar5 = NormalizerSpec::name_abi_cxx11_(pNStack_18);
      auVar6 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar5);
      NormalizerSpec::mutable_precompiled_charsmap_abi_cxx11_(pNStack_18);
      name._M_str = auVar6._0_8_;
      name._M_len = (size_t)this;
      normalizer::Builder::GetPrecompiledCharsMap(name,auVar6._8_8_);
      bVar2 = util::Status::ok((Status *)this);
      if (!bVar2) {
        return this;
      }
      sentencepiece::util::Status::~Status((Status *)this);
    }
  }
  util::OkStatus();
  return this;
}

Assistant:

util::Status SentencePieceTrainer::PopulateNormalizerSpec(
    NormalizerSpec *normalizer_spec, bool is_denormalizer) {
  CHECK_OR_RETURN(normalizer_spec);

  if (!normalizer_spec->normalization_rule_tsv().empty()) {
    CHECK_OR_RETURN(normalizer_spec->precompiled_charsmap().empty())
        << "precompiled_charsmap is already defined.";
    normalizer::Builder::CharsMap chars_map;
    RETURN_IF_ERROR(normalizer::Builder::LoadCharsMap(
        normalizer_spec->normalization_rule_tsv(), &chars_map));
    RETURN_IF_ERROR(normalizer::Builder::CompileCharsMap(
        chars_map, normalizer_spec->mutable_precompiled_charsmap()));
    normalizer_spec->set_name("user_defined");
  } else if (!is_denormalizer) {
    if (normalizer_spec->name().empty()) {
      normalizer_spec->set_name(kDefaultNormalizerName);
    }
    if (normalizer_spec->precompiled_charsmap().empty()) {
      RETURN_IF_ERROR(normalizer::Builder::GetPrecompiledCharsMap(
          normalizer_spec->name(),
          normalizer_spec->mutable_precompiled_charsmap()));
    }
  }

  return util::OkStatus();
}